

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O0

char * hash_exit_code_to_str(hash_exit_code_t value)

{
  hash_exit_code_t value_local;
  char *local_8;
  
  switch(value) {
  case HASH_EXIT_SUCCESS:
    local_8 = "Success";
    break;
  case HASH_EXIT_FAILURE:
    local_8 = "Failure";
    break;
  case HASH_EXIT_MISMATCH:
    local_8 = "Mismatch";
    break;
  case HASH_EXIT_MANIFEST_MISSING_ENTRY:
    local_8 = "Manifest Missing Entry";
    break;
  case HASH_EXIT_MANIFEST_UNKNOWN_HASH:
    local_8 = "Manifest Unknown Hash";
    break;
  case HASH_EXIT_MANIFEST_FILE_ERROR:
    local_8 = "Manifest File Error";
    break;
  default:
    local_8 = "?";
  }
  return local_8;
}

Assistant:

static char const * hash_exit_code_to_str(hash_exit_code_t value) {
    switch (value) {
        case HASH_EXIT_SUCCESS: return "Success";
        case HASH_EXIT_FAILURE: return "Failure";
        case HASH_EXIT_MISMATCH: return "Mismatch";
        case HASH_EXIT_MANIFEST_MISSING_ENTRY: return "Manifest Missing Entry";
        case HASH_EXIT_MANIFEST_UNKNOWN_HASH: return "Manifest Unknown Hash";
        case HASH_EXIT_MANIFEST_FILE_ERROR: return "Manifest File Error";
    }
    return "?";
}